

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VehicleState.cc
# Opt level: O1

void __thiscall VehicleState::Propagator::Propagate(Propagator *this,double dt,bool intSTM)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  undefined8 uVar5;
  void *pvVar6;
  undefined8 *puVar7;
  Index row;
  long lVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  undefined7 in_register_00000031;
  long lVar12;
  state_type xint;
  vector<double,_std::allocator<double>_> col;
  VectorXd eigcol;
  MatrixXd STM;
  vector<double,_std::allocator<double>_> local_428;
  vector<double,_std::allocator<double>_> local_408;
  double local_3e8;
  vector<double,_std::allocator<double>_> local_3e0;
  undefined8 *local_3c8 [2];
  double local_3b8;
  double dStack_3b0;
  runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
  local_3a0;
  undefined1 local_2d0 [224];
  value_type_conflict1 local_1f0;
  value_type_conflict1 vStack_1e8;
  step_adjuster_type local_1e0;
  undefined4 local_1d8;
  pointer local_1d0;
  pointer pdStack_1c8;
  pointer local_1c0;
  pointer pdStack_1b8;
  pointer local_1b0;
  pointer pdStack_1a8;
  pointer local_1a0;
  pointer pdStack_198;
  pointer local_190;
  pointer pdStack_188;
  pointer local_180;
  pointer pdStack_178;
  bool local_170;
  Propagator local_168;
  
  this->intSTM_ = intSTM;
  local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((int)CONCAT71(in_register_00000031,intSTM) == 0) {
    local_3a0.
    super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
    ._0_1_ = 0;
    local_3a0.
    super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
    .m_resizer.m_initialized = false;
    local_3a0.
    super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
    .m_first_call = false;
    local_3a0.
    super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
    ._3_5_ = 0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&local_428,6,(value_type_conflict1 *)&local_3a0);
    *local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0];
    local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[1] = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[1];
    local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[2] = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[2];
    local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[3] = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[0];
    local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[4] = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[1];
    local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[5] = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[2];
  }
  else {
    local_3a0.
    super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
    ._0_1_ = 0;
    local_3a0.
    super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
    .m_resizer.m_initialized = false;
    local_3a0.
    super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
    .m_first_call = false;
    local_3a0.
    super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
    ._3_5_ = 0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&local_428,0x2a,(value_type_conflict1 *)&local_3a0);
    *local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0];
    local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[1] = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[1];
    local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[2] = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[2];
    local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[3] = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[0];
    local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[4] = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[1];
    local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[5] = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[2];
    local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[6] = 1.0;
    local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[0xd] = 1.0;
    local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[0x14] = 1.0;
    local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[0x1b] = 1.0;
    local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[0x22] = 1.0;
    local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[0x29] = 1.0;
  }
  local_3e8 = this->t_;
  local_3b8 = this->reltol_;
  dStack_3b0 = this->abstol_;
  local_3a0.
  super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
  ._1_2_ = 0x100;
  memset(&local_3a0.
          super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
          .m_dxdt,0,0xc2);
  boost::numeric::odeint::
  runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
  ::runge_kutta_dopri5
            ((runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
              *)local_2d0,&local_3a0);
  local_2d0._216_4_ = SUB84(local_3b8,0);
  local_2d0._208_8_ = dStack_3b0;
  local_2d0._220_4_ = (int)((ulong)local_3b8 >> 0x20);
  local_1f0 = 1.0;
  vStack_1e8 = 1.0;
  local_1e0.m_max_dt = 0.0;
  local_1d8._0_1_ = false;
  local_1d8._1_1_ = false;
  local_1d8._2_1_ = false;
  local_1d8._3_1_ = false;
  local_1d0 = (pointer)0x0;
  pdStack_1c8 = (pointer)0x0;
  local_1c0 = (pointer)0x0;
  pdStack_1b8 = (pointer)0x0;
  local_1b0 = (pointer)0x0;
  pdStack_1a8 = (pointer)0x0;
  local_1a0 = (pointer)0x0;
  pdStack_198 = (pointer)0x0;
  local_190 = (pointer)0x0;
  pdStack_188 = (pointer)0x0;
  local_180 = (pointer)0x0;
  pdStack_178 = (pointer)0x0;
  local_170 = true;
  local_168.use20x20_ = this->use20x20_;
  local_168.useJ2_ = this->useJ2_;
  local_168.usedrag_ = this->usedrag_;
  local_168.useSRP_ = this->useSRP_;
  local_168.useLuniSolar_ = this->useLuniSolar_;
  local_168.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0];
  local_168.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1];
  local_168.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2];
  local_168.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0];
  local_168.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1];
  local_168.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2];
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&local_168.STM_,
             (DenseStorage<double,__1,__1,__1,_0> *)&this->STM_);
  dVar4 = dt + local_3e8;
  memcpy(&local_168.a_,&this->a_,0xe1);
  boost::numeric::odeint::
  integrate_adaptive<boost::numeric::odeint::controlled_runge_kutta<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,std::allocator<double>>,double,std::vector<double,std::allocator<double>>,double,boost::numeric::odeint::range_algebra,boost::numeric::odeint::default_operations,boost::numeric::odeint::initially_resizer>,boost::numeric::odeint::default_error_checker<double,boost::numeric::odeint::range_algebra,boost::numeric::odeint::default_operations>,boost::numeric::odeint::default_step_adjuster<double,double>,boost::numeric::odeint::initially_resizer,boost::numeric::odeint::explicit_error_stepper_fsal_tag>,VehicleState::Propagator,std::vector<double,std::allocator<double>>,double>
            ((controlled_runge_kutta<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_boost::numeric::odeint::default_error_checker<double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations>,_boost::numeric::odeint::default_step_adjuster<double,_double>,_boost::numeric::odeint::initially_resizer,_boost::numeric::odeint::explicit_error_stepper_fsal_tag>
              *)local_2d0,&local_168,&local_428,local_3e8,dVar4,this->dt_var_);
  free(local_168.STM_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  if (pdStack_188 != (pointer)0x0) {
    operator_delete(pdStack_188,(long)pdStack_178 - (long)pdStack_188);
  }
  if (local_1a0 != (pointer)0x0) {
    operator_delete(local_1a0,(long)local_190 - (long)local_1a0);
  }
  if (pdStack_1b8 != (pointer)0x0) {
    operator_delete(pdStack_1b8,(long)pdStack_1a8 - (long)pdStack_1b8);
  }
  if (local_1d0 != (pointer)0x0) {
    operator_delete(local_1d0,(long)local_1c0 - (long)local_1d0);
  }
  boost::numeric::odeint::
  runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
  ::~runge_kutta_dopri5
            ((runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
              *)local_2d0);
  boost::numeric::odeint::
  runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
  ::~runge_kutta_dopri5(&local_3a0);
  (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = *local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
  (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[1];
  (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[2];
  (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[3];
  (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[4];
  (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[5];
  this->t_ = dVar4;
  if (intSTM) {
    local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x6;
    local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x6;
    local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_3a0,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_408);
    lVar10 = 0;
    lVar12 = 0;
    do {
      local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)operator_new(0x30);
      local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + 6;
      local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[4] = 0.0;
      local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[5] = 0.0;
      local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[2] = 0.0;
      local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[3] = 0.0;
      *local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_start = 0.0;
      local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = 0.0;
      *local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_start = local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar12 * 6 + 6];
      local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar12 * 6 + 7];
      local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[2] = local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar12 * 6 + 8];
      local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[3] = local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar12 * 6 + 9];
      local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[4] = local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar12 * 6 + 10];
      local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[5] = local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar12 * 6 + 0xb];
      local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      std::vector<double,_std::allocator<double>_>::vector(&local_3e0,&local_408);
      Util::StdVec2Eigen((Util *)local_3c8,&local_3e0);
      if (local_3e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_3e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_3e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      puVar7 = (undefined8 *)
               (local_3a0.
                super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
                ._0_8_ + (long)local_3a0.
                               super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
                               .m_dxdt.m_v.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start * lVar12 * 8);
      if (((ulong)puVar7 & 7) == 0) {
        uVar11 = (uint)((ulong)puVar7 >> 3) & 1;
        if (((ulong)puVar7 >> 3 & 1) != 0) {
          *puVar7 = *local_3c8[0];
        }
        pvVar6 = (void *)(local_3a0.
                          super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
                          ._0_8_ + (long)local_3a0.
                                         super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
                                         .m_dxdt.m_v.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start * lVar10);
        uVar9 = (ulong)uVar11;
        do {
          uVar5 = (local_3c8[0] + uVar9)[1];
          puVar7 = (undefined8 *)((long)pvVar6 + uVar9 * 8);
          *puVar7 = local_3c8[0][uVar9];
          puVar7[1] = uVar5;
          uVar9 = uVar9 + 2;
        } while (uVar9 < (6 - uVar11 & 0xfffffffe | uVar11));
        if ((ulong)uVar11 != 0) {
          uVar9 = (ulong)(6 - (((uint)pvVar6 >> 3 & 1) != 0) & 0xfffffffe |
                         (uint)((ulong)pvVar6 >> 3) & 1) - 1;
          do {
            *(undefined8 *)((long)pvVar6 + uVar9 * 8 + 8) = local_3c8[0][uVar9 + 1];
            uVar9 = uVar9 + 1;
          } while (uVar9 < 5);
        }
      }
      else {
        lVar8 = 0;
        do {
          *(undefined8 *)
           (local_3a0.
            super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
            ._0_8_ + lVar8 * 8 +
                     (long)local_3a0.
                           super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
                           .m_dxdt.m_v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start * lVar10) = local_3c8[0][lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 6);
      }
      free(local_3c8[0]);
      if (local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar5 = local_3a0.
              super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
              ._0_8_;
      lVar12 = lVar12 + 1;
      lVar10 = lVar10 + 8;
    } while (lVar12 != 6);
    if (((pointer)(this->STM_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows !=
         local_3a0.
         super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
         .m_dxdt.m_v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start) ||
       ((pointer)(this->STM_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_cols !=
        local_3a0.
        super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
        .m_dxdt.m_v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      if ((local_3a0.
           super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
           .m_dxdt.m_v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish != (pointer)0x0 &&
           local_3a0.
           super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
           .m_dxdt.m_v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start != (pointer)0x0) &&
         (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) /
                 SEXT816((long)local_3a0.
                               super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
                               .m_dxdt.m_v.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_finish),0) <
          (long)local_3a0.
                super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
                .m_dxdt.m_v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start)) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar7 = std::ios::widen;
        __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&this->STM_,
                 (long)local_3a0.
                       super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
                       .m_dxdt.m_v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish *
                 (long)local_3a0.
                       super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
                       .m_dxdt.m_v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,
                 (Index)local_3a0.
                        super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
                        .m_dxdt.m_v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                 (Index)local_3a0.
                        super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
                        .m_dxdt.m_v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish);
    }
    pdVar3 = (this->STM_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
             .m_data;
    lVar10 = (this->STM_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
             .m_cols * (this->STM_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       .m_storage.m_rows;
    uVar9 = lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < lVar10) {
      lVar12 = 0;
      do {
        pdVar1 = (double *)(uVar5 + lVar12 * 8);
        dVar4 = pdVar1[1];
        pdVar2 = pdVar3 + lVar12;
        *pdVar2 = *pdVar1;
        pdVar2[1] = dVar4;
        lVar12 = lVar12 + 2;
      } while (lVar12 < (long)uVar9);
    }
    if ((long)uVar9 < lVar10) {
      do {
        pdVar3[uVar9] = *(double *)(uVar5 + uVar9 * 8);
        uVar9 = uVar9 + 1;
      } while (lVar10 - uVar9 != 0);
    }
    free((void *)local_3a0.
                 super_explicit_error_stepper_fsal_base<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_(unsigned_short)5,_(unsigned_short)5,_(unsigned_short)4,_std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
                 ._0_8_);
  }
  if (local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Propagator::Propagate(double dt, bool intSTM){

		//set flag
		this->intSTM_ = intSTM;

		//build state
		state_type xint;
		if (intSTM) {
			xint.assign(42,0.0);
			xint[0] = this->pos_[0];
			xint[1] = this->pos_[1];
			xint[2] = this->pos_[2];
			xint[3] = this->vel_[0];
			xint[4] = this->vel_[1];
			xint[5] = this->vel_[2];

			//stm initialization
			xint[6] = 1.0;
			xint[13] = 1.0;
			xint[20] = 1.0;
			xint[27] = 1.0;
			xint[34] = 1.0;
			xint[41] = 1.0;

		} else {
			xint.assign(6,0.0);
			xint[0] = this->pos_[0];
			xint[1] = this->pos_[1];
			xint[2] = this->pos_[2];
			xint[3] = this->vel_[0];
			xint[4] = this->vel_[1];
			xint[5] = this->vel_[2];
		} //fi

		// std::cout << "before: " << this->pos_ << std::endl;

		//times
		double t1 = this->t_;
		double t2 = t1 + dt;

		//call integrator
		ode::integrate_adaptive( ode::make_controlled( this->abstol_ , this->reltol_ ,
			error_stepper_type() ) , *this , xint , t1 , t2 , this->dt_var_ );

		//update class members
		this->pos_[0] = xint[0];
		this->pos_[1] = xint[1];
		this->pos_[2] = xint[2];
		this->vel_[0] = xint[3];
		this->vel_[1] = xint[4];
		this->vel_[2] = xint[5];
		this->t_ = t2;

		//if we propagated the STM, write it out
		if(intSTM){
			Eigen::MatrixXd STM = Eigen::MatrixXd::Zero(6,6);

			for (int ii = 0; ii < 6; ++ii) {
				std::vector<double> col(6,0);
				col[0] = xint[6*ii + 0 + 6];
				col[1] = xint[6*ii + 1 + 6];
				col[2] = xint[6*ii + 2 + 6];
				col[3] = xint[6*ii + 3 + 6];
				col[4] = xint[6*ii + 4 + 6];
				col[5] = xint[6*ii + 5 + 6];

				//convert to eigen
				Eigen::VectorXd eigcol = Util::StdVec2Eigen(col);

				//assign
				STM.block(0,ii,6,1) = eigcol;

			} // for

			//update
			this->STM_ = STM;

		} //fi

		// std::cout << "after: "<< this->pos_ << std::endl;

	}